

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void tplt_xfer(char *name,FILE *in,FILE *out,int *lineno)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ushort **ppuVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  undefined8 local_420;
  char line [1000];
  
  local_420 = (FILE *)in;
LAB_0010997d:
  pcVar4 = fgets(line,1000,local_420);
  if ((pcVar4 == (char *)0x0) || ((line[0] == '%' && (line[1] == '%')))) {
    return;
  }
  *lineno = *lineno + 1;
  if (name != (char *)0x0) {
    lVar6 = 0;
    iVar7 = 0;
    cVar1 = line[0];
    do {
      iVar8 = (int)lVar6;
      iVar3 = iVar8;
      if (cVar1 == 'P') {
        iVar2 = strncmp(line + iVar8,"Parse",5);
        if (iVar2 == 0) {
          if (iVar8 != 0) {
            ppuVar5 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar5 + (ulong)(byte)line[(long)iVar8 + -1] * 2 + 1) & 4) != 0)
            goto LAB_00109a4e;
          }
          if (iVar8 - iVar7 != 0 && iVar7 <= iVar8) {
            fprintf((FILE *)out,"%.*s",(ulong)(uint)(iVar8 - iVar7),line + iVar7);
          }
          fputs(name,(FILE *)out);
          iVar3 = iVar8 + 4;
          iVar7 = iVar8 + 5;
        }
      }
      else if (cVar1 == '\0') goto LAB_00109a5e;
LAB_00109a4e:
      cVar1 = line[(long)iVar3 + 1];
      lVar6 = (long)iVar3 + 1;
    } while( true );
  }
  lVar6 = 0;
  goto LAB_00109a65;
LAB_00109a5e:
  lVar6 = (long)iVar7;
LAB_00109a65:
  fputs(line + lVar6,(FILE *)out);
  goto LAB_0010997d;
}

Assistant:

PRIVATE void tplt_xfer(char *name, FILE *in, FILE *out, int *lineno)
{
  int i, iStart;
  char line[LINESIZE];
  while( fgets(line,LINESIZE,in) && (line[0]!='%' || line[1]!='%') ){
    (*lineno)++;
    iStart = 0;
    if( name ){
      for(i=0; line[i]; i++){
        if( line[i]=='P' && strncmp(&line[i],"Parse",5)==0
          && (i==0 || !ISALPHA(line[i-1]))
        ){
          if( i>iStart ) fprintf(out,"%.*s",i-iStart,&line[iStart]);
          fprintf(out,"%s",name);
          i += 4;
          iStart = i+1;
        }
      }
    }
    fprintf(out,"%s",&line[iStart]);
  }
}